

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O0

void __thiscall xLearn::Solver::Solver(Solver *this)

{
  Checker *in_RDI;
  HyperParam *in_stack_00000080;
  
  HyperParam::HyperParam(in_stack_00000080);
  Checker::Checker(in_RDI);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::vector
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x19b0bd);
  FileSpliter::FileSpliter((FileSpliter *)(in_RDI + 0xb));
  in_RDI[0xb].menu_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[0xb].menu_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[0xb].args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x19b102);
  return;
}

Assistant:

Solver() 
    : score_(nullptr),
      loss_(nullptr),
      metric_(nullptr) { }